

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::
_preBegin__profile_GLSL__technique__pass__states__blend_equation_separate__alpha
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *additionalText;
  bool bVar1;
  ulong in_RAX;
  undefined8 *puVar2;
  StringHash SVar3;
  undefined4 uVar4;
  uint *puVar5;
  ulong uVar6;
  xmlChar **ppxVar7;
  bool bVar8;
  bool failed;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  puVar2 = (undefined8 *)
           GeneratedSaxParser::StackMemoryManager::newObject
                     (&(this->
                       super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                       ).super_ParserTemplateBase.mStackMemoryManager,0x10);
  *puVar2 = 0;
  puVar2[1] = 0;
  *attributeDataPtr = puVar2;
  ppxVar7 = attributes->attributes;
  bVar8 = true;
  if (ppxVar7 != (xmlChar **)0x0) {
    do {
      text = *ppxVar7;
      if (text == (ParserChar *)0x0) {
        validationDataPtr = (void **)0x3;
      }
      else {
        SVar3 = GeneratedSaxParser::Utils::calculateStringHash(text);
        additionalText = ppxVar7[1];
        ppxVar7 = ppxVar7 + 2;
        if (SVar3 == 0x76887d) {
          puVar2[1] = additionalText;
        }
        else if (SVar3 == 0x7c83b5) {
          SVar3 = GeneratedSaxParser::Utils::calculateStringHash
                            (additionalText,(bool *)((long)&uStack_38 + 7));
          bVar8 = false;
          uVar6 = 0;
          puVar5 = &DAT_0085ac18;
          do {
            if (*(StringHash *)(puVar5 + -2) == SVar3) {
              uStack_38 = uStack_38 & 0xffffffffffffff;
              validationDataPtr = (void **)(ulong)*puVar5;
            }
            uVar4 = SUB84(validationDataPtr,0);
            if (*(StringHash *)(puVar5 + -2) == SVar3) break;
            bVar8 = 3 < uVar6;
            uVar6 = uVar6 + 1;
            puVar5 = puVar5 + 4;
          } while (uVar6 != 5);
          if (bVar8) {
            uStack_38 = CONCAT17(1,(undefined7)uStack_38);
            uVar4 = 5;
          }
          *(undefined4 *)puVar2 = uVar4;
          if (uStack_38._7_1_ == '\x01') {
            bVar8 = false;
            bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_ATTRIBUTE_PARSING_FAILED,0x6836e1,0x7c83b5,additionalText);
            if (!bVar1) goto LAB_007324c0;
            validationDataPtr = (void **)0x1;
          }
          else {
LAB_007324c0:
            validationDataPtr = (void **)0x4;
            bVar8 = true;
          }
          if (!bVar8) goto LAB_007324cf;
        }
        else {
          bVar8 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_UNKNOWN_ATTRIBUTE,0x6836e1,text,additionalText);
          validationDataPtr = (void **)0x1;
          if (bVar8) goto LAB_007324cf;
        }
        validationDataPtr = (void **)0x0;
      }
LAB_007324cf:
    } while ((int)validationDataPtr == 0);
    if ((int)validationDataPtr == 3) {
      bVar8 = true;
    }
    else {
      bVar8 = false;
    }
  }
  return bVar8;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__profile_GLSL__technique__pass__states__blend_equation_separate__alpha( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__profile_GLSL__technique__pass__states__blend_equation_separate__alpha( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

profile_GLSL__technique__pass__states__blend_equation_separate__alpha__AttributeData* attributeData = newData<profile_GLSL__technique__pass__states__blend_equation_separate__alpha__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_VALUE:
    {
bool failed;
attributeData->value = Utils::toEnum<ENUM__gl_blend_equation_enum, StringHash, ENUM__gl_blend_equation_enum__COUNT>(attributeValue, failed, ENUM__gl_blend_equation_enumMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_ALPHA,
        HASH_ATTRIBUTE_VALUE,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_PARAM:
    {

attributeData->param = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->param, strlen(attributeData->param));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_ALPHA,
            HASH_ATTRIBUTE_PARAM,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_ALPHA, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}